

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instanceid.c
# Opt level: O3

LY_ERR lyplg_type_dup_node_instanceid(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  LY_ERR LVar1;
  
  (dup->field_2).dec64 = 0;
  *(undefined8 *)((long)&dup->field_2 + 8) = 0;
  dup->_canonical = (char *)0x0;
  dup->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&dup->field_2 + 0x10) = 0;
  LVar1 = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if (LVar1 == LY_SUCCESS) {
    if ((original->field_2).target != (ly_path *)0x0) {
      LVar1 = ly_path_dup(ctx,(original->field_2).target,&(dup->field_2).target);
      if (LVar1 != LY_SUCCESS) goto LAB_001c0348;
    }
    dup->realtype = original->realtype;
    LVar1 = LY_SUCCESS;
  }
  else {
LAB_001c0348:
    lyplg_type_free_instanceid(ctx,dup);
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyplg_type_dup_node_instanceid(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;

    memset(dup, 0, sizeof *dup);

    /* canonical value */
    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    if (original->target) {
        /* copy path */
        ret = ly_path_dup(ctx, original->target, &dup->target);
        LY_CHECK_GOTO(ret, error);
    } /* else is the special path "/" that has no target stored */

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_instanceid(ctx, dup);
    return ret;
}